

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<GradientColor*,std::vector<GradientColor,std::allocator<GradientColor>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,float *__a,float *__b,float *__c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  fVar1 = *__a;
  fVar2 = *__b;
  fVar3 = *__c;
  if (fVar2 <= fVar1) {
    if (fVar3 <= fVar1) {
      if (fVar2 < fVar3) goto LAB_0010615b;
      goto LAB_00106172;
    }
  }
  else {
    if (fVar2 < fVar3) {
LAB_00106172:
      uVar4 = *__result;
      uVar5 = __result[1];
      uVar6 = *(undefined8 *)(__b + 2);
      *__result = *(undefined8 *)__b;
      __result[1] = uVar6;
      *(undefined8 *)__b = uVar4;
      *(undefined8 *)(__b + 2) = uVar5;
      return;
    }
    if (fVar1 < fVar3) {
LAB_0010615b:
      uVar4 = *__result;
      uVar5 = __result[1];
      uVar6 = *(undefined8 *)(__c + 2);
      *__result = *(undefined8 *)__c;
      __result[1] = uVar6;
      *(undefined8 *)__c = uVar4;
      *(undefined8 *)(__c + 2) = uVar5;
      return;
    }
  }
  uVar4 = *__result;
  uVar5 = __result[1];
  uVar6 = *(undefined8 *)(__a + 2);
  *__result = *(undefined8 *)__a;
  __result[1] = uVar6;
  *(undefined8 *)__a = uVar4;
  *(undefined8 *)(__a + 2) = uVar5;
  return;
}

Assistant:

bool operator<(const GradientColor& col) const noexcept { return pos < col.pos; }